

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalHashAggregate::GetData
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  LocalSourceState *this_00;
  GlobalSourceState *pGVar1;
  SourceResultType SVar2;
  idx_t iVar3;
  reference this_01;
  reference this_02;
  reference this_03;
  type sink_p;
  unique_lock<std::mutex> guard;
  OperatorSourceInput source_input;
  LocalSourceState local_b0;
  unique_lock<std::mutex> local_a8;
  mutex *local_98;
  DataChunk *local_90;
  mutex *local_88;
  vector<duckdb::HashAggregateGroupingData,_true> *local_80;
  vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
  *local_78;
  pointer local_70;
  ExecutionContext *local_68;
  OperatorSourceInput *local_60;
  PhysicalHashAggregate *local_58;
  const_reference local_50;
  OperatorSourceInput local_48;
  
  local_68 = context;
  local_70 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(this->super_PhysicalOperator).sink_state);
  pGVar1 = input->global_state;
  this_00 = input->local_state + 1;
  local_80 = &this->groupings;
  local_70 = local_70 + 1;
  local_88 = &pGVar1[1].super_StateWithBlockableTasks.lock;
  local_78 = (vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
              *)(input->local_state + 2);
  local_98 = &(pGVar1->super_StateWithBlockableTasks).lock;
  local_90 = chunk;
  local_60 = input;
  local_58 = this;
  while( true ) {
    if (this_00->_vptr_LocalSourceState == (_func_int **)0xffffffffffffffff) {
      optional_idx::optional_idx
                ((optional_idx *)&local_48,*(idx_t *)&pGVar1[1].super_StateWithBlockableTasks);
      this_00->_vptr_LocalSourceState = (_func_int **)local_48.global_state;
    }
    iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
    if ((ulong)(((long)(local_58->groupings).
                       super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                       .
                       super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_58->groupings).
                       super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                       .
                       super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7) <=
        iVar3) {
      return chunk->count == 0;
    }
    local_50 = vector<duckdb::HashAggregateGroupingData,_true>::operator[](local_80,iVar3);
    this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::operator[]
                        ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)local_70,iVar3);
    this_02 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                            *)local_88,iVar3);
    local_48.global_state =
         unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
         ::operator*(this_02);
    this_03 = vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_true>
              ::operator[](local_78,iVar3);
    local_48.local_state =
         unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>::
         operator*(this_03);
    local_48.interrupt_state = local_60->interrupt_state;
    sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&this_01->table_state);
    chunk = local_90;
    SVar2 = RadixPartitionedHashTable::GetData
                      (&local_50->table_data,local_68,local_90,sink_p,&local_48);
    if (SVar2 == BLOCKED) {
      return BLOCKED;
    }
    if (chunk->count != 0) break;
    local_a8._M_device = local_98;
    local_a8._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_a8);
    local_a8._M_owns = true;
    iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
    optional_idx::optional_idx((optional_idx *)&local_b0,iVar3 + 1);
    this_00->_vptr_LocalSourceState = local_b0._vptr_LocalSourceState;
    iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
    if (*(ulong *)&pGVar1[1].super_StateWithBlockableTasks < iVar3) {
      iVar3 = optional_idx::GetIndex((optional_idx *)this_00);
      LOCK();
      *(idx_t *)&pGVar1[1].super_StateWithBlockableTasks = iVar3;
      UNLOCK();
    }
    optional_idx::optional_idx
              ((optional_idx *)&local_b0,*(idx_t *)&pGVar1[1].super_StateWithBlockableTasks);
    this_00->_vptr_LocalSourceState = local_b0._vptr_LocalSourceState;
    ::std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  }
  return HAVE_MORE_OUTPUT;
}

Assistant:

SourceResultType PhysicalHashAggregate::GetData(ExecutionContext &context, DataChunk &chunk,
                                                OperatorSourceInput &input) const {
	auto &sink_gstate = sink_state->Cast<HashAggregateGlobalSinkState>();
	auto &gstate = input.global_state.Cast<HashAggregateGlobalSourceState>();
	auto &lstate = input.local_state.Cast<HashAggregateLocalSourceState>();
	while (true) {
		if (!lstate.radix_idx.IsValid()) {
			lstate.radix_idx = gstate.state_index.load();
		}
		const auto radix_idx = lstate.radix_idx.GetIndex();
		if (radix_idx >= groupings.size()) {
			break;
		}

		auto &grouping = groupings[radix_idx];
		auto &radix_table = grouping.table_data;
		auto &grouping_gstate = sink_gstate.grouping_states[radix_idx];

		OperatorSourceInput source_input {*gstate.radix_states[radix_idx], *lstate.radix_states[radix_idx],
		                                  input.interrupt_state};
		auto res = radix_table.GetData(context, chunk, *grouping_gstate.table_state, source_input);
		if (res == SourceResultType::BLOCKED) {
			return res;
		}
		if (chunk.size() != 0) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		}

		// move to the next table
		auto guard = gstate.Lock();
		lstate.radix_idx = lstate.radix_idx.GetIndex() + 1;
		if (lstate.radix_idx.GetIndex() > gstate.state_index) {
			// we have not yet worked on the table
			// move the global index forwards
			gstate.state_index = lstate.radix_idx.GetIndex();
		}
		lstate.radix_idx = gstate.state_index.load();
	}

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}